

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

bool absl::lts_20240722::anon_unknown_0::ParseInfinityOrNan(char *begin,char *end,ParsedFloat *out)

{
  int iVar1;
  bool local_39;
  char *local_30;
  char *nan_begin;
  ParsedFloat *out_local;
  char *end_local;
  char *begin_local;
  
  if ((long)end - (long)begin < 3) {
    begin_local._7_1_ = false;
  }
  else {
    switch(*begin) {
    case 'I':
    case 'i':
      iVar1 = strings_internal::memcasecmp(begin + 1,"nf",2);
      if (iVar1 == 0) {
        out->type = kInfinity;
        if (((long)end - (long)begin < 8) ||
           (iVar1 = strings_internal::memcasecmp(begin + 3,"inity",5), iVar1 != 0)) {
          out->end = begin + 3;
        }
        else {
          out->end = begin + 8;
        }
        begin_local._7_1_ = true;
      }
      else {
        begin_local._7_1_ = false;
      }
      break;
    default:
      begin_local._7_1_ = false;
      break;
    case 'N':
    case 'n':
      iVar1 = strings_internal::memcasecmp(begin + 1,"an",2);
      if (iVar1 == 0) {
        out->type = kNan;
        out->end = begin + 3;
        if ((begin + 3 < end) && (begin[3] == '(')) {
          local_30 = begin + 4;
          while( true ) {
            local_39 = false;
            if (local_30 < end) {
              local_39 = IsNanChar(*local_30);
            }
            if (local_39 == false) break;
            local_30 = local_30 + 1;
          }
          if ((local_30 < end) && (*local_30 == ')')) {
            out->subrange_begin = begin + 4;
            out->subrange_end = local_30;
            out->end = local_30 + 1;
          }
        }
        begin_local._7_1_ = true;
      }
      else {
        begin_local._7_1_ = false;
      }
    }
  }
  return begin_local._7_1_;
}

Assistant:

bool ParseInfinityOrNan(const char* begin, const char* end,
                        strings_internal::ParsedFloat* out) {
  if (end - begin < 3) {
    return false;
  }
  switch (*begin) {
    case 'i':
    case 'I': {
      // An infinity string consists of the characters "inf" or "infinity",
      // case insensitive.
      if (strings_internal::memcasecmp(begin + 1, "nf", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kInfinity;
      if (end - begin >= 8 &&
          strings_internal::memcasecmp(begin + 3, "inity", 5) == 0) {
        out->end = begin + 8;
      } else {
        out->end = begin + 3;
      }
      return true;
    }
    case 'n':
    case 'N': {
      // A NaN consists of the characters "nan", case insensitive, optionally
      // followed by a parenthesized sequence of zero or more alphanumeric
      // characters and/or underscores.
      if (strings_internal::memcasecmp(begin + 1, "an", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kNan;
      out->end = begin + 3;
      // NaN is allowed to be followed by a parenthesized string, consisting of
      // only the characters [a-zA-Z0-9_].  Match that if it's present.
      begin += 3;
      if (begin < end && *begin == '(') {
        const char* nan_begin = begin + 1;
        while (nan_begin < end && IsNanChar(*nan_begin)) {
          ++nan_begin;
        }
        if (nan_begin < end && *nan_begin == ')') {
          // We found an extra NaN specifier range
          out->subrange_begin = begin + 1;
          out->subrange_end = nan_begin;
          out->end = nan_begin + 1;
        }
      }
      return true;
    }
    default:
      return false;
  }
}